

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

void * dlmalloc(size_t bytes)

{
  mchunkptr pmVar1;
  long *plVar2;
  size_t *psVar3;
  byte *pbVar4;
  tbinptr pmVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  binmap_t bVar9;
  malloc_tree_chunk **ppmVar10;
  uint uVar11;
  tbinptr pmVar12;
  char *pcVar13;
  tbinptr pmVar14;
  mstate m;
  void *pvVar15;
  mchunkptr pmVar16;
  long lVar17;
  int *piVar18;
  malloc_tree_chunk *pmVar19;
  malloc_tree_chunk *pmVar20;
  ulong uVar21;
  mchunkptr pmVar22;
  mchunkptr pmVar23;
  size_t dvs;
  char *pcVar24;
  binmap_t bVar25;
  char *oldbase;
  malloc_segment *pmVar26;
  uint uVar27;
  mchunkptr pmVar28;
  malloc_chunk *pmVar29;
  malloc_chunk *pmVar30;
  long lVar31;
  malloc_chunk *pmVar32;
  malloc_tree_chunk *pmVar33;
  tbinptr pmVar34;
  ulong uVar35;
  byte bVar36;
  ulong uVar37;
  malloc_tree_chunk **ppmVar38;
  char *pcVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  sVar6 = _gm_.dvsize;
  bVar9 = _gm_.treemap;
  bVar25 = _gm_.smallmap;
  if (bytes < 0xe9) {
    pcVar24 = &DAT_00000020;
    if (0x16 < bytes) {
      pcVar24 = (char *)(ulong)((int)bytes + 0x17U & 0x1f0);
    }
    bVar36 = (byte)((ulong)pcVar24 >> 3);
    uVar27 = _gm_.smallmap >> (bVar36 & 0x1f);
    if ((uVar27 & 3) != 0) {
      uVar27 = (uVar27 & 1 | (uint)((ulong)pcVar24 >> 3)) ^ 1;
      uVar21 = (ulong)(uVar27 << 4);
      pcVar39 = (char *)((long)_gm_.smallbins + uVar21);
      lVar17 = *(long *)((long)_gm_.smallbins + uVar21 + 0x10);
      pcVar24 = *(char **)(lVar17 + 0x10);
      if (pcVar39 == pcVar24) {
        _gm_.smallmap = _gm_.smallmap & ~(1 << (uVar27 & 0x1f));
      }
      else {
        if ((pcVar24 < _gm_.least_addr) || (*(long *)(pcVar24 + 0x18) != lVar17)) goto LAB_0010443f;
        *(char **)(pcVar24 + 0x18) = pcVar39;
        *(char **)((long)_gm_.smallbins + uVar21 + 0x10) = pcVar24;
      }
      *(ulong *)(lVar17 + 8) = (ulong)(uVar27 << 3) + 3;
      pbVar4 = (byte *)(lVar17 + 8 + (ulong)(uVar27 << 3));
      *pbVar4 = *pbVar4 | 1;
      return (void *)(lVar17 + 0x10);
    }
    if (_gm_.dvsize < pcVar24) {
      if (uVar27 != 0) {
        uVar11 = 2 << (bVar36 & 0x1f);
        uVar11 = (-uVar11 | uVar11) & uVar27 << (bVar36 & 0x1f);
        uVar27 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        uVar21 = (ulong)(uVar27 << 4);
        pcVar13 = (char *)((long)_gm_.smallbins + uVar21);
        lVar17 = *(long *)((long)_gm_.smallbins + uVar21 + 0x10);
        pcVar39 = *(char **)(lVar17 + 0x10);
        if (pcVar13 == pcVar39) {
          bVar25 = _gm_.smallmap & ~(1 << (uVar27 & 0x1f));
          _gm_.smallmap = bVar25;
        }
        else {
          if ((pcVar39 < _gm_.least_addr) || (*(long *)(pcVar39 + 0x18) != lVar17))
          goto LAB_0010443f;
          *(char **)(pcVar39 + 0x18) = pcVar13;
          *(char **)((long)_gm_.smallbins + uVar21 + 0x10) = pcVar39;
        }
        uVar21 = (ulong)(uVar27 << 3);
        uVar35 = uVar21 - (long)pcVar24;
        if (uVar35 < 0x20) {
          *(ulong *)(lVar17 + 8) = uVar21 | 3;
          pbVar4 = (byte *)(lVar17 + 8 + uVar21);
          *pbVar4 = *pbVar4 | 1;
          return (void *)(lVar17 + 0x10);
        }
        *(ulong *)(lVar17 + 8) = (ulong)pcVar24 | 3;
        *(ulong *)(pcVar24 + lVar17 + 8) = uVar35 | 1;
        *(ulong *)(lVar17 + uVar21) = uVar35;
        if (sVar6 != 0) {
          uVar27 = (uint)(sVar6 >> 3);
          uVar21 = (ulong)(uVar27 * 2);
          if ((bVar25 >> (uVar27 & 0x1f) & 1) == 0) {
            _gm_.smallmap = bVar25 | 1 << ((byte)(sVar6 >> 3) & 0x1f);
            pmVar22 = (mchunkptr)(_gm_.smallbins + uVar21);
          }
          else {
            pmVar22 = _gm_.smallbins[uVar21 + 2];
            if (_gm_.smallbins[uVar21 + 2] < _gm_.least_addr) goto LAB_0010443f;
          }
          _gm_.smallbins[uVar21 + 2] = _gm_.dv;
          pmVar22->bk = _gm_.dv;
          (_gm_.dv)->fd = pmVar22;
          (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar21);
        }
        _gm_.dvsize = uVar35;
        _gm_.dv = (mchunkptr)(pcVar24 + lVar17);
        return (void *)(lVar17 + 0x10);
      }
      if (_gm_.treemap != 0) {
        uVar27 = 0;
        if (_gm_.treemap != 0) {
          for (; (_gm_.treemap >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
          }
        }
        pmVar14 = _gm_.treebins[uVar27];
        uVar21 = (pmVar14->head & 0xfffffffffffffff8) - (long)pcVar24;
        pmVar12 = pmVar14;
        while ((pmVar19 = pmVar12->child[0], pmVar19 != (malloc_tree_chunk *)0x0 ||
               (pmVar19 = pmVar12->child[1], pmVar19 != (malloc_tree_chunk *)0x0))) {
          uVar35 = (pmVar19->head & 0xfffffffffffffff8) - (long)pcVar24;
          pmVar12 = pmVar19;
          if (uVar35 < uVar21) {
            pmVar14 = pmVar19;
            uVar21 = uVar35;
          }
        }
        if (pmVar14 < _gm_.least_addr) goto LAB_0010443f;
        pmVar12 = pmVar14->bk;
        pmVar19 = pmVar14->parent;
        if (pmVar12 == pmVar14) {
          if (pmVar14->child[1] == (tbinptr)0x0) {
            if (pmVar14->child[0] == (tbinptr)0x0) {
              pmVar12 = (tbinptr)0x0;
              goto LAB_001042d4;
            }
            pmVar34 = pmVar14->child[0];
            ppmVar10 = pmVar14->child;
          }
          else {
            pmVar34 = pmVar14->child[1];
            ppmVar10 = pmVar14->child + 1;
          }
          do {
            do {
              ppmVar38 = ppmVar10;
              pmVar12 = pmVar34;
              pmVar34 = pmVar12->child[1];
              ppmVar10 = pmVar12->child + 1;
            } while (pmVar12->child[1] != (malloc_tree_chunk *)0x0);
            pmVar34 = pmVar12->child[0];
            ppmVar10 = pmVar12->child;
          } while (pmVar12->child[0] != (malloc_tree_chunk *)0x0);
          if (ppmVar38 < _gm_.least_addr) goto LAB_0010443f;
          *ppmVar38 = (malloc_tree_chunk *)0x0;
        }
        else {
          pmVar20 = pmVar14->fd;
          if (((pmVar20 < _gm_.least_addr) || (pmVar20->bk != pmVar14)) || (pmVar12->fd != pmVar14))
          goto LAB_0010443f;
          pmVar20->bk = pmVar12;
          pmVar12->fd = pmVar20;
        }
LAB_001042d4:
        pmVar34 = (tbinptr)_gm_.least_addr;
        if (pmVar19 != (malloc_tree_chunk *)0x0) {
          uVar27 = pmVar14->index;
          if (pmVar14 == _gm_.treebins[uVar27]) {
            _gm_.treebins[uVar27] = pmVar12;
            pmVar34 = (tbinptr)_gm_.least_addr;
            if (pmVar12 == (tbinptr)0x0) {
              _gm_.treemap = bVar9 & ~(1 << (uVar27 & 0x1f));
            }
            else {
LAB_0010432d:
              if (pmVar12 < pmVar34) goto LAB_0010443f;
              pmVar12->parent = pmVar19;
              pmVar5 = pmVar14->child[0];
              if (pmVar5 != (tbinptr)0x0) {
                if (pmVar5 < pmVar34) goto LAB_0010443f;
                pmVar12->child[0] = pmVar5;
                pmVar5->parent = pmVar12;
              }
              pmVar5 = pmVar14->child[1];
              if (pmVar5 != (tbinptr)0x0) {
                if (pmVar5 < pmVar34) goto LAB_0010443f;
                pmVar12->child[1] = pmVar5;
                pmVar5->parent = pmVar12;
              }
            }
          }
          else {
            if (pmVar19 < _gm_.least_addr) goto LAB_0010443f;
            pmVar19->child[pmVar19->child[0] != pmVar14] = pmVar12;
            if (pmVar12 != (tbinptr)0x0) goto LAB_0010432d;
          }
        }
        if (uVar21 < 0x20) {
          pmVar14->head = (ulong)(pcVar24 + uVar21) | 3;
          pbVar4 = (byte *)((long)&pmVar14->head + (long)(pcVar24 + uVar21));
          *pbVar4 = *pbVar4 | 1;
          uVar21 = _gm_.dvsize;
          pmVar22 = _gm_.dv;
        }
        else {
          pmVar22 = (mchunkptr)(pcVar24 + (long)&pmVar14->prev_foot);
          pmVar14->head = (ulong)pcVar24 | 3;
          *(ulong *)((long)&pmVar14->head + (long)pcVar24) = uVar21 | 1;
          *(ulong *)((long)&pmVar22->prev_foot + uVar21) = uVar21;
          if (sVar6 == 0) goto LAB_001039be;
          uVar27 = (uint)(sVar6 >> 3);
          uVar35 = (ulong)(uVar27 * 2);
          if ((bVar25 >> (uVar27 & 0x1f) & 1) == 0) {
            _gm_.smallmap = 1 << ((byte)(sVar6 >> 3) & 0x1f) | bVar25;
            pmVar23 = (mchunkptr)(_gm_.smallbins + uVar35);
          }
          else {
            pmVar23 = _gm_.smallbins[uVar35 + 2];
            if (_gm_.smallbins[uVar35 + 2] < _gm_.least_addr) goto LAB_0010443f;
          }
          _gm_.smallbins[uVar35 + 2] = _gm_.dv;
          pmVar23->bk = _gm_.dv;
          (_gm_.dv)->fd = pmVar23;
          (_gm_.dv)->bk = (mchunkptr)(_gm_.smallbins + uVar35);
        }
        goto LAB_001039be;
      }
    }
  }
  else {
    pcVar24 = (char *)0xffffffffffffffff;
    if (bytes < 0xffffffffffffff80) {
      pcVar24 = (char *)(bytes + 0x17 & 0xfffffffffffffff0);
      if (_gm_.treemap != 0) {
        uVar27 = (uint)(bytes + 0x17 >> 8);
        if (uVar27 == 0) {
          uVar21 = 0;
        }
        else {
          uVar21 = 0x1f;
          if (uVar27 < 0x10000) {
            uVar11 = 0x1f;
            if (uVar27 != 0) {
              for (; uVar27 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar21 = (ulong)((uint)(((ulong)pcVar24 >>
                                     ((ulong)(byte)(0x26 - (char)(uVar11 ^ 0x1f)) & 0x3f) & 1) != 0)
                             + (uVar11 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        uVar35 = -(long)pcVar24;
        pmVar14 = _gm_.treebins[uVar21];
        if (pmVar14 == (tbinptr)0x0) {
          pmVar19 = (malloc_tree_chunk *)0x0;
          pmVar12 = (tbinptr)0x0;
        }
        else {
          bVar36 = 0x39 - (char)(uVar21 >> 1);
          if ((int)uVar21 == 0x1f) {
            bVar36 = 0;
          }
          lVar17 = (long)pcVar24 << (bVar36 & 0x3f);
          pmVar19 = (malloc_tree_chunk *)0x0;
          pmVar12 = (tbinptr)0x0;
          do {
            uVar37 = (pmVar14->head & 0xfffffffffffffff8) - (long)pcVar24;
            if ((uVar37 < uVar35) && (pmVar12 = pmVar14, uVar35 = uVar37, uVar37 == 0)) {
              uVar35 = 0;
              pmVar20 = pmVar14;
              goto LAB_00103801;
            }
            pmVar20 = pmVar14->child[1];
            pmVar14 = *(tbinptr *)((long)pmVar14 + (lVar17 >> 0x3f) * -8 + 0x20);
            pmVar33 = pmVar20;
            if (pmVar20 == pmVar14) {
              pmVar33 = pmVar19;
            }
            if (pmVar20 != (malloc_tree_chunk *)0x0) {
              pmVar19 = pmVar33;
            }
            lVar17 = lVar17 * 2;
          } while (pmVar14 != (malloc_tree_chunk *)0x0);
        }
        pmVar14 = pmVar12;
        if (pmVar19 == (malloc_tree_chunk *)0x0 && pmVar12 == (tbinptr)0x0) {
          uVar27 = 2 << ((byte)uVar21 & 0x1f);
          uVar27 = (-uVar27 | uVar27) & _gm_.treemap;
          if (uVar27 == 0) goto LAB_0010389b;
          uVar11 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          pmVar19 = _gm_.treebins[uVar11];
          pmVar14 = (tbinptr)0x0;
        }
        while (pmVar20 = pmVar19, pmVar19 != (malloc_tree_chunk *)0x0) {
LAB_00103801:
          uVar37 = (pmVar20->head & 0xfffffffffffffff8) - (long)pcVar24;
          uVar21 = uVar37;
          if (uVar35 <= uVar37) {
            uVar21 = uVar35;
          }
          pmVar19 = pmVar20->child[0];
          if (uVar35 > uVar37) {
            pmVar14 = pmVar20;
          }
          uVar35 = uVar21;
          if (pmVar19 == (malloc_tree_chunk *)0x0) {
            pmVar19 = pmVar20->child[1];
          }
        }
        if ((pmVar14 != (tbinptr)0x0) && (uVar35 < _gm_.dvsize - (long)pcVar24)) {
          if ((pmVar14 < _gm_.least_addr) || ((long)pcVar24 < 1)) goto LAB_0010443f;
          pmVar19 = pmVar14->bk;
          pmVar20 = pmVar14->parent;
          if (pmVar19 == pmVar14) {
            if (pmVar14->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar14->child[0] == (malloc_tree_chunk *)0x0) {
                pmVar19 = (malloc_tree_chunk *)0x0;
                goto LAB_00104020;
              }
              pmVar33 = pmVar14->child[0];
              ppmVar10 = pmVar14->child;
            }
            else {
              pmVar33 = pmVar14->child[1];
              ppmVar10 = pmVar14->child + 1;
            }
            do {
              do {
                ppmVar38 = ppmVar10;
                pmVar19 = pmVar33;
                pmVar33 = pmVar19->child[1];
                ppmVar10 = pmVar19->child + 1;
              } while (pmVar19->child[1] != (malloc_tree_chunk *)0x0);
              pmVar33 = pmVar19->child[0];
              ppmVar10 = pmVar19->child;
            } while (pmVar19->child[0] != (malloc_tree_chunk *)0x0);
            if (ppmVar38 < _gm_.least_addr) goto LAB_0010443f;
            *ppmVar38 = (malloc_tree_chunk *)0x0;
          }
          else {
            pmVar33 = pmVar14->fd;
            if (((pmVar33 < _gm_.least_addr) || (pmVar33->bk != pmVar14)) ||
               (pmVar19->fd != pmVar14)) goto LAB_0010443f;
            pmVar33->bk = pmVar19;
            pmVar19->fd = pmVar33;
          }
LAB_00104020:
          pmVar33 = (malloc_tree_chunk *)_gm_.least_addr;
          if (pmVar20 != (malloc_tree_chunk *)0x0) {
            uVar27 = pmVar14->index;
            if (pmVar14 == _gm_.treebins[uVar27]) {
              _gm_.treebins[uVar27] = pmVar19;
              pmVar33 = (malloc_tree_chunk *)_gm_.least_addr;
              if (pmVar19 == (malloc_tree_chunk *)0x0) {
                _gm_.treemap = bVar9 & ~(1 << (uVar27 & 0x1f));
              }
              else {
LAB_00104072:
                if (pmVar19 < pmVar33) goto LAB_0010443f;
                pmVar19->parent = pmVar20;
                pmVar20 = pmVar14->child[0];
                if (pmVar20 != (malloc_tree_chunk *)0x0) {
                  if (pmVar20 < pmVar33) goto LAB_0010443f;
                  pmVar19->child[0] = pmVar20;
                  pmVar20->parent = pmVar19;
                }
                pmVar20 = pmVar14->child[1];
                if (pmVar20 != (malloc_tree_chunk *)0x0) {
                  if (pmVar20 < pmVar33) goto LAB_0010443f;
                  pmVar19->child[1] = pmVar20;
                  pmVar20->parent = pmVar19;
                }
              }
            }
            else {
              if (pmVar20 < _gm_.least_addr) goto LAB_0010443f;
              pmVar20->child[pmVar20->child[0] != pmVar14] = pmVar19;
              if (pmVar19 != (malloc_tree_chunk *)0x0) goto LAB_00104072;
            }
          }
          if (uVar35 < 0x20) {
            pmVar14->head = (ulong)(pcVar24 + uVar35) | 3;
            pbVar4 = (byte *)((long)&pmVar14->head + (long)(pcVar24 + uVar35));
            *pbVar4 = *pbVar4 | 1;
            uVar21 = _gm_.dvsize;
            pmVar22 = _gm_.dv;
          }
          else {
            pmVar32 = (malloc_chunk *)(pcVar24 + (long)&pmVar14->prev_foot);
            pmVar14->head = (ulong)pcVar24 | 3;
            *(ulong *)((long)&pmVar14->head + (long)pcVar24) = uVar35 | 1;
            *(ulong *)((long)&pmVar32->prev_foot + uVar35) = uVar35;
            if (0xff < uVar35) {
              uVar27 = (uint)(uVar35 >> 8);
              if (uVar27 == 0) {
                uVar11 = 0;
              }
              else {
                uVar11 = 0x1f;
                if (uVar27 < 0x10000) {
                  uVar11 = 0x1f;
                  if (uVar27 != 0) {
                    for (; uVar27 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                    }
                  }
                  uVar11 = (uint)((uVar35 >> ((ulong)(byte)(0x26 - (char)(uVar11 ^ 0x1f)) & 0x3f) &
                                  1) != 0) + (uVar11 ^ 0x1f) * 2 ^ 0x3e;
                }
              }
              pmVar29 = (malloc_chunk *)(_gm_.treebins + uVar11);
              *(uint *)&pmVar32[1].bk = uVar11;
              pmVar32[1].prev_foot = 0;
              pmVar32[1].head = 0;
              if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
                _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar11 & 0x1f);
                pmVar29->prev_foot = (size_t)pmVar32;
                pmVar32[1].fd = pmVar29;
              }
              else {
                bVar36 = 0x39 - (char)(uVar11 >> 1);
                if (uVar11 == 0x1f) {
                  bVar36 = 0;
                }
                lVar17 = uVar35 << (bVar36 & 0x3f);
                pmVar29 = (malloc_chunk *)pmVar29->prev_foot;
                do {
                  pmVar30 = pmVar29;
                  if ((pmVar30->head & 0xfffffffffffffff8) == uVar35) {
                    if ((pmVar30 < _gm_.least_addr) ||
                       (pmVar29 = pmVar30->fd, pmVar29 < _gm_.least_addr)) goto LAB_0010443f;
                    pmVar29->bk = pmVar32;
                    pmVar30->fd = pmVar32;
                    pmVar32->fd = pmVar29;
                    pmVar32->bk = pmVar30;
                    pmVar32[1].fd = (malloc_chunk *)0x0;
                    uVar21 = _gm_.dvsize;
                    pmVar22 = _gm_.dv;
                    goto LAB_001039be;
                  }
                  lVar31 = lVar17 >> 0x3f;
                  lVar17 = lVar17 * 2;
                  pmVar29 = *(malloc_chunk **)((long)pmVar30 + lVar31 * -8 + 0x20);
                } while (pmVar29 != (malloc_chunk *)0x0);
                plVar2 = (long *)((long)pmVar30 + lVar31 * -8 + 0x20);
                if (plVar2 < _gm_.least_addr) goto LAB_0010443f;
                *plVar2 = (long)pmVar32;
                pmVar32[1].fd = pmVar30;
              }
              pmVar32->bk = pmVar32;
              pmVar32->fd = pmVar32;
              uVar21 = _gm_.dvsize;
              pmVar22 = _gm_.dv;
              goto LAB_001039be;
            }
            uVar35 = uVar35 >> 3;
            if ((_gm_.smallmap >> ((uint)uVar35 & 0x1f) & 1) == 0) {
              _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar35 & 0x1f);
              pmVar22 = (malloc_chunk *)(_gm_.smallbins + uVar35 * 2);
            }
            else {
              pmVar22 = _gm_.smallbins[uVar35 * 2 + 2];
              if (_gm_.smallbins[uVar35 * 2 + 2] < _gm_.least_addr) goto LAB_0010443f;
            }
            _gm_.smallbins[uVar35 * 2 + 2] = pmVar32;
            pmVar22->bk = pmVar32;
            pmVar32->fd = pmVar22;
            pmVar32->bk = (malloc_chunk *)(_gm_.smallbins + uVar35 * 2);
            uVar21 = _gm_.dvsize;
            pmVar22 = _gm_.dv;
          }
          goto LAB_001039be;
        }
      }
    }
  }
LAB_0010389b:
  uVar21 = _gm_.dvsize - (long)pcVar24;
  if (pcVar24 <= _gm_.dvsize) {
    pmVar14 = (tbinptr)_gm_.dv;
    if (uVar21 < 0x20) {
      (_gm_.dv)->head = _gm_.dvsize | 3;
      pbVar4 = (byte *)((long)&(_gm_.dv)->head + _gm_.dvsize);
      *pbVar4 = *pbVar4 | 1;
      uVar21 = 0;
      pmVar22 = (mchunkptr)0x0;
    }
    else {
      *(ulong *)((long)&(_gm_.dv)->head + (long)pcVar24) = uVar21 | 1;
      *(ulong *)((long)&(_gm_.dv)->prev_foot + _gm_.dvsize) = uVar21;
      (_gm_.dv)->head = (ulong)pcVar24 | 3;
      pmVar22 = (mchunkptr)(pcVar24 + (long)&(_gm_.dv)->prev_foot);
    }
    goto LAB_001039be;
  }
  uVar21 = _gm_.topsize - (long)pcVar24;
  if (_gm_.topsize < pcVar24 || uVar21 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if (((((byte)_gm_.mflags & 1) != 0) && (mparams.mmap_threshold <= pcVar24)) &&
       (_gm_.topsize != 0)) {
      pcVar39 = (char *)(-mparams.page_size & (ulong)(pcVar24 + mparams.page_size + 0x3e));
      if (_gm_.footprint_limit == 0) {
        if (pcVar24 < pcVar39) goto LAB_001039d7;
      }
      else if ((pcVar24 < pcVar39 && _gm_.footprint < pcVar39 + _gm_.footprint) &&
               pcVar39 + _gm_.footprint <= _gm_.footprint_limit) {
LAB_001039d7:
        pcVar13 = (char *)mmap((void *)0x0,(size_t)pcVar39,3,0x22,-1,0);
        if (pcVar13 != (char *)0xffffffffffffffff) {
          uVar21 = (ulong)(-(int)pcVar13 - 0x10U & 0xf);
          pmVar14 = (tbinptr)(pcVar13 + uVar21);
          *(ulong *)(pcVar13 + uVar21) = uVar21;
          *(char **)(pcVar13 + uVar21 + 8) = pcVar39 + (-0x20 - uVar21);
          pcVar24 = pcVar39 + (-0x18 - uVar21) + (long)pmVar14;
          pcVar24[0] = '\v';
          pcVar24[1] = '\0';
          pcVar24[2] = '\0';
          pcVar24[3] = '\0';
          pcVar24[4] = '\0';
          pcVar24[5] = '\0';
          pcVar24[6] = '\0';
          pcVar24[7] = '\0';
          pcVar24 = pcVar13 + -0x10 + (long)pcVar39;
          pcVar24[0] = '\0';
          pcVar24[1] = '\0';
          pcVar24[2] = '\0';
          pcVar24[3] = '\0';
          pcVar24[4] = '\0';
          pcVar24[5] = '\0';
          pcVar24[6] = '\0';
          pcVar24[7] = '\0';
          if ((_gm_.least_addr == (char *)0x0) || (pcVar13 < _gm_.least_addr)) {
            _gm_.least_addr = pcVar13;
          }
          _gm_.footprint = (size_t)(pcVar39 + _gm_.footprint);
          uVar21 = _gm_.dvsize;
          pmVar22 = _gm_.dv;
          if (_gm_.max_footprint < _gm_.footprint) {
            _gm_.max_footprint = _gm_.footprint;
          }
          goto LAB_001039be;
        }
      }
    }
    pcVar39 = (char *)(-mparams.granularity & (ulong)(pcVar24 + mparams.granularity + 0x5f));
    if (pcVar39 <= pcVar24) {
      return (void *)0x0;
    }
    if ((_gm_.footprint_limit != 0) &&
       (_gm_.footprint_limit < pcVar39 + _gm_.footprint ||
        pcVar39 + _gm_.footprint <= _gm_.footprint)) {
      return (void *)0x0;
    }
    m = (mstate)mmap((void *)0x0,(size_t)pcVar39,3,0x22,-1,0);
    pmVar22 = _gm_.top;
    bVar40 = m != (mstate)0xffffffffffffffff;
    if (!bVar40) {
LAB_001045a4:
      piVar18 = __errno_location();
      *piVar18 = 0xc;
      return (void *)0x0;
    }
    _gm_.footprint = (size_t)(pcVar39 + _gm_.footprint);
    if (_gm_.max_footprint < _gm_.footprint) {
      _gm_.max_footprint = _gm_.footprint;
    }
    if (_gm_.top == (mchunkptr)0x0) {
      if ((_gm_.least_addr == (char *)0x0) || (m < _gm_.least_addr)) {
        _gm_.least_addr = (char *)m;
      }
      _gm_.seg.sflags = 1;
      _gm_.magic = mparams.magic;
      _gm_.release_checks = 0xfff;
      lVar17 = 0x20;
      lVar31 = 0x10c198;
      _gm_.seg.base = (char *)m;
      _gm_.seg.size = (size_t)pcVar39;
      do {
        *(long *)(lVar31 + 0x18) = lVar31;
        *(long *)(lVar31 + 0x10) = lVar31;
        lVar31 = lVar31 + 0x10;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
      uVar21 = (ulong)(-(int)m - 0x10U & 0xf);
      _gm_.top = (mchunkptr)((long)m->smallbins + (uVar21 - 0x48));
      _gm_.topsize = (size_t)(pcVar39 + (-0x50 - uVar21));
      *(size_t *)((long)m->smallbins + (uVar21 - 0x40)) = _gm_.topsize | 1;
      pcVar39 = (char *)((long)&m[-1].max_footprint + (long)pcVar39);
      pcVar39[0] = 'P';
      pcVar39[1] = '\0';
      pcVar39[2] = '\0';
      pcVar39[3] = '\0';
      pcVar39[4] = '\0';
      pcVar39[5] = '\0';
      pcVar39[6] = '\0';
      pcVar39[7] = '\0';
LAB_00103d5a:
      _gm_.trim_check = mparams.trim_threshold;
    }
    else {
      pmVar26 = &_gm_.seg;
      do {
        if (m == (mstate)((long)&((mchunkptr)pmVar26->base)->prev_foot + pmVar26->size)) {
          if ((((_gm_.top < m) && ((mchunkptr)pmVar26->base <= _gm_.top)) &&
              ((pmVar26->sflags & 8) == 0)) && ((pmVar26->sflags & 1) != 0)) {
            pmVar26->size = (size_t)(pcVar39 + pmVar26->size);
            pcVar39 = pcVar39 + _gm_.topsize;
            uVar21 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
            _gm_.topsize = (long)pcVar39 - uVar21;
            psVar3 = &(_gm_.top)->head;
            _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar21);
            *(size_t *)((long)psVar3 + uVar21) = _gm_.topsize | 1;
            pcVar39 = (char *)((long)&pmVar22->head + (long)pcVar39);
            pcVar39[0] = 'P';
            pcVar39[1] = '\0';
            pcVar39[2] = '\0';
            pcVar39[3] = '\0';
            pcVar39[4] = '\0';
            pcVar39[5] = '\0';
            pcVar39[6] = '\0';
            pcVar39[7] = '\0';
            goto LAB_00103d5a;
          }
          break;
        }
        pmVar26 = pmVar26->next;
      } while (pmVar26 != (malloc_segment *)0x0);
      if (m < _gm_.least_addr) {
        _gm_.least_addr = (char *)m;
      }
      pmVar26 = &_gm_.seg;
      do {
        pcVar13 = pmVar26->base;
        if (pcVar13 == pcVar39 + (long)(m->smallbins + -9)) {
          if (((pmVar26->sflags & 8) == 0 & (byte)pmVar26->sflags) != 0) {
            pmVar26->base = (char *)m;
            pmVar26->size = (size_t)(pcVar39 + pmVar26->size);
            pvVar15 = prepend_alloc(m,pcVar13,pcVar24,(ulong)bVar40);
            return pvVar15;
          }
          break;
        }
        pmVar26 = pmVar26->next;
      } while (pmVar26 != (malloc_segment *)0x0);
      for (pmVar26 = &_gm_.seg;
          (_gm_.top < (mchunkptr)pmVar26->base ||
          (pmVar23 = (mchunkptr)((long)&((mchunkptr)pmVar26->base)->prev_foot + pmVar26->size),
          pmVar23 <= _gm_.top)); pmVar26 = pmVar26->next) {
      }
      pmVar28 = (mchunkptr)((long)pmVar23 + ((ulong)(0x4fU - (int)pmVar23 & 0xf) - 0x5f));
      pmVar1 = _gm_.top + 1;
      if (pmVar28 < pmVar1) {
        pmVar28 = _gm_.top;
      }
      uVar21 = (ulong)(-(int)m - 0x10U & 0xf);
      _gm_.top = (mchunkptr)((long)m->smallbins + (uVar21 - 0x48));
      _gm_.topsize = (size_t)(pcVar39 + (-0x50 - uVar21));
      *(size_t *)((long)m->smallbins + (uVar21 - 0x40)) = _gm_.topsize | 1;
      pcVar13 = (char *)((long)&m[-1].max_footprint + (long)pcVar39);
      pcVar13[0] = 'P';
      pcVar13[1] = '\0';
      pcVar13[2] = '\0';
      pcVar13[3] = '\0';
      pcVar13[4] = '\0';
      pcVar13[5] = '\0';
      pcVar13[6] = '\0';
      pcVar13[7] = '\0';
      _gm_.trim_check = mparams.trim_threshold;
      pmVar28->head = 0x33;
      sVar6 = CONCAT44(_gm_.seg._28_4_,_gm_.seg.sflags);
      pmVar28[1].prev_foot = (size_t)_gm_.seg.next;
      pmVar28[1].head = sVar6;
      pmVar28->fd = (malloc_chunk *)_gm_.seg.base;
      pmVar28->bk = (malloc_chunk *)_gm_.seg.size;
      auVar8 = _DAT_00109020;
      auVar7 = _DAT_00109010;
      _gm_.seg.sflags = (flag_t)bVar40;
      pmVar16 = pmVar28 + 2;
      if (pmVar28 + 2 < pmVar23) {
        pmVar16 = pmVar23;
      }
      uVar21 = (long)pmVar16 + (-0x39 - (long)pmVar28);
      auVar43._8_4_ = (int)uVar21;
      auVar43._0_8_ = uVar21;
      auVar43._12_4_ = (int)(uVar21 >> 0x20);
      auVar41._0_8_ = uVar21 >> 3;
      auVar41._8_8_ = auVar43._8_8_ >> 3;
      uVar35 = 0;
      auVar41 = auVar41 ^ _DAT_00109020;
      _gm_.seg.base = (char *)m;
      _gm_.seg.size = (size_t)pcVar39;
      _gm_.seg.next = (malloc_segment *)&pmVar28->fd;
      do {
        auVar42._8_4_ = (int)uVar35;
        auVar42._0_8_ = uVar35;
        auVar42._12_4_ = (int)(uVar35 >> 0x20);
        auVar43 = (auVar42 | auVar7) ^ auVar8;
        if ((bool)(~(auVar43._4_4_ == auVar41._4_4_ && auVar41._0_4_ < auVar43._0_4_ ||
                    auVar41._4_4_ < auVar43._4_4_) & 1)) {
          (&pmVar28[1].bk)[uVar35] = (malloc_chunk *)0xb;
        }
        if ((auVar43._12_4_ != auVar41._12_4_ || auVar43._8_4_ <= auVar41._8_4_) &&
            auVar43._12_4_ <= auVar41._12_4_) {
          (&pmVar28[2].prev_foot)[uVar35] = 0xb;
        }
        uVar35 = uVar35 + 2;
      } while (((uVar21 >> 3) + 2 & 0xfffffffffffffffe) != uVar35);
      uVar21 = (long)pmVar28 - (long)pmVar22;
      if (uVar21 != 0) {
        *(byte *)&pmVar28->head = (byte)pmVar28->head & 0xfe;
        pmVar22->head = uVar21 | 1;
        pmVar28->prev_foot = uVar21;
        if (uVar21 < 0x100) {
          uVar21 = uVar21 >> 3;
          if ((_gm_.smallmap >> ((uint)uVar21 & 0x1f) & 1) == 0) {
            _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar21 & 0x1f);
            pmVar12 = (tbinptr)(_gm_.smallbins + uVar21 * 2);
          }
          else {
            pmVar12 = (tbinptr)_gm_.smallbins[uVar21 * 2 + 2];
            if ((tbinptr)_gm_.smallbins[uVar21 * 2 + 2] < _gm_.least_addr) {
LAB_0010443f:
              abort();
            }
          }
          _gm_.smallbins[uVar21 * 2 + 2] = pmVar22;
          pmVar12->bk = (malloc_tree_chunk *)pmVar22;
          lVar17 = 0x18;
          lVar31 = 0x10;
          pmVar14 = (tbinptr)(_gm_.smallbins + uVar21 * 2);
        }
        else {
          uVar27 = (uint)(uVar21 >> 8);
          if (uVar27 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = 0x1f;
            if (uVar27 < 0x10000) {
              uVar11 = 0x1f;
              if (uVar27 != 0) {
                for (; uVar27 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                }
              }
              uVar11 = (uint)((uVar21 >> ((ulong)(byte)(0x26 - (char)(uVar11 ^ 0x1f)) & 0x3f) & 1)
                             != 0) + (uVar11 ^ 0x1f) * 2 ^ 0x3e;
            }
          }
          pmVar32 = (malloc_chunk *)(_gm_.treebins + uVar11);
          *(uint *)&pmVar22[1].bk = uVar11;
          pmVar1->prev_foot = 0;
          pmVar1->head = 0;
          if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
            _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar11 & 0x1f);
            pmVar32->prev_foot = (size_t)pmVar22;
            pmVar22[1].fd = pmVar32;
          }
          else {
            bVar36 = 0x39 - (char)(uVar11 >> 1);
            if (uVar11 == 0x1f) {
              bVar36 = 0;
            }
            lVar17 = uVar21 << (bVar36 & 0x3f);
            pmVar14 = (tbinptr)pmVar32->prev_foot;
            do {
              pmVar12 = pmVar14;
              if ((pmVar12->head & 0xfffffffffffffff8) == uVar21) {
                if ((pmVar12 < _gm_.least_addr) ||
                   (pmVar19 = pmVar12->fd, pmVar19 < _gm_.least_addr)) goto LAB_0010443f;
                pmVar19->bk = (malloc_tree_chunk *)pmVar22;
                pmVar12->fd = (malloc_tree_chunk *)pmVar22;
                pmVar22->fd = (malloc_chunk *)pmVar19;
                lVar17 = 0x30;
                lVar31 = 0x18;
                pmVar14 = (tbinptr)0x0;
                goto LAB_0010458c;
              }
              lVar31 = lVar17 >> 0x3f;
              lVar17 = lVar17 * 2;
              pmVar14 = *(tbinptr *)((long)pmVar12 + lVar31 * -8 + 0x20);
            } while (pmVar14 != (tbinptr)0x0);
            pcVar39 = (char *)((long)pmVar12 + lVar31 * -8 + 0x20);
            if (pcVar39 < _gm_.least_addr) goto LAB_0010443f;
            *(mchunkptr *)pcVar39 = pmVar22;
            pmVar22[1].fd = (malloc_chunk *)pmVar12;
          }
          lVar17 = 0x10;
          lVar31 = 0x18;
          pmVar12 = (tbinptr)pmVar22;
          pmVar14 = (tbinptr)pmVar22;
        }
LAB_0010458c:
        *(tbinptr *)((long)&pmVar22->prev_foot + lVar31) = pmVar12;
        *(tbinptr *)((long)&pmVar22->prev_foot + lVar17) = pmVar14;
      }
    }
    uVar21 = _gm_.topsize - (long)pcVar24;
    if (_gm_.topsize < pcVar24 || uVar21 == 0) goto LAB_001045a4;
  }
  pmVar14 = (tbinptr)_gm_.top;
  psVar3 = &(_gm_.top)->head;
  _gm_.topsize = uVar21;
  _gm_.top = (mchunkptr)(pcVar24 + (long)&(_gm_.top)->prev_foot);
  *(ulong *)((long)psVar3 + (long)pcVar24) = uVar21 | 1;
  ((mchunkptr)pmVar14)->head = (ulong)pcVar24 | 3;
  uVar21 = _gm_.dvsize;
  pmVar22 = _gm_.dv;
LAB_001039be:
  _gm_.dv = pmVar22;
  _gm_.dvsize = uVar21;
  return &pmVar14->fd;
}

Assistant:

void* dlmalloc(size_t bytes) {
  /*
     Basic algorithm:
     If a small request (< 256 bytes minus per-chunk overhead):
       1. If one exists, use a remainderless chunk in associated smallbin.
          (Remainderless means that there are too few excess bytes to
          represent as a chunk.)
       2. If it is big enough, use the dv chunk, which is normally the
          chunk adjacent to the one used for the most recent small request.
       3. If one exists, split the smallest available chunk in a bin,
          saving remainder in dv.
       4. If it is big enough, use the top chunk.
       5. If available, get memory from system and use it
     Otherwise, for a large request:
       1. Find the smallest available binned chunk that fits, and use it
          if it is better fitting than dv chunk, splitting if necessary.
       2. If better fitting than any binned chunk, use the dv chunk.
       3. If it is big enough, use the top chunk.
       4. If request size >= mmap threshold, try to directly mmap this chunk.
       5. If available, get memory from system and use it

     The ugly goto's here ensure that postaction occurs along all paths.
  */

#if USE_LOCKS
  ensure_initialization(); /* initialize in sys_alloc if not using locks */
#endif

  if (!PREACTION(gm)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = gm->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(gm, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(gm, b, p, idx);
        set_inuse_and_pinuse(gm, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }

      else if (nb > gm->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(gm, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(gm, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(gm, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(gm, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }

        else if (gm->treemap != 0 && (mem = tmalloc_small(gm, nb)) != 0) {
          check_malloced_chunk(gm, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (gm->treemap != 0 && (mem = tmalloc_large(gm, nb)) != 0) {
        check_malloced_chunk(gm, mem, nb);
        goto postaction;
      }
    }

    if (nb <= gm->dvsize) {
      size_t rsize = gm->dvsize - nb;
      mchunkptr p = gm->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = gm->dv = chunk_plus_offset(p, nb);
        gm->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = gm->dvsize;
        gm->dvsize = 0;
        gm->dv = 0;
        set_inuse_and_pinuse(gm, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    else if (nb < gm->topsize) { /* Split top */
      size_t rsize = gm->topsize -= nb;
      mchunkptr p = gm->top;
      mchunkptr r = gm->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(gm, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(gm, gm->top);
      check_malloced_chunk(gm, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(gm, nb);

  postaction:
    POSTACTION(gm);
    return mem;
  }

  return 0;
}